

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aipc.c
# Opt level: O0

void nn_aipc_term(nn_aipc *self)

{
  long in_RDI;
  
  if (*(int *)(in_RDI + 0x58) != 1) {
    nn_backtrace_print();
    fprintf(_stderr,"Assertion failed: %d == %s (%s:%d)\n",(ulong)*(uint *)(in_RDI + 0x58),
            "NN_AIPC_STATE_IDLE",
            "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/ipc/aipc.c"
            ,0x44);
    fflush(_stderr);
    nn_err_abort();
  }
  nn_list_item_term((nn_list_item *)0x16641b);
  nn_fsm_event_term((nn_fsm_event *)(in_RDI + 0x6f8));
  nn_fsm_event_term((nn_fsm_event *)(in_RDI + 0x6d0));
  nn_sipc_term((nn_sipc *)0x16644b);
  nn_usock_term((nn_usock *)0x166458);
  nn_fsm_term((nn_fsm *)0x166461);
  return;
}

Assistant:

void nn_aipc_term (struct nn_aipc *self)
{
    nn_assert_state (self, NN_AIPC_STATE_IDLE);

    nn_list_item_term (&self->item);
    nn_fsm_event_term (&self->done);
    nn_fsm_event_term (&self->accepted);
    nn_sipc_term (&self->sipc);
    nn_usock_term (&self->usock);
    nn_fsm_term (&self->fsm);
}